

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O3

void terminal_setflags(EditLine *el)

{
  wchar_t *pwVar1;
  char **ppcVar2;
  char *__s1;
  char *pcVar3;
  int iVar4;
  wchar_t wVar5;
  uint uVar6;
  uint uVar7;
  
  (el->el_terminal).t_flags = L'\0';
  pwVar1 = (el->el_terminal).t_val;
  if ((el->el_tty).t_tabs == L'\0') {
    wVar5 = L'\0';
  }
  else {
    if (pwVar1[1] == L'\0') {
      wVar5 = L'\0';
    }
    else {
      wVar5 = (uint)(pwVar1[5] == L'\0') << 3;
    }
    (el->el_terminal).t_flags = wVar5;
  }
  uVar6 = 0x40;
  if (pwVar1[4] == L'\0') {
    uVar6 = (uint)(pwVar1[7] != L'\0') << 6;
  }
  (el->el_terminal).t_flags = wVar5 | uVar6;
  ppcVar2 = (el->el_terminal).t_str;
  uVar7 = 0;
  if (ppcVar2[3] != (char *)0x0) {
    uVar7 = (uint)(*ppcVar2[3] != '\0') << 2;
  }
  wVar5 = uVar7 | wVar5 | uVar6;
  (el->el_terminal).t_flags = wVar5;
  if ((ppcVar2[6] == (char *)0x0) || (uVar6 = 2, *ppcVar2[6] == '\0')) {
    uVar6 = 0;
    if (ppcVar2[0x1e] != (char *)0x0) {
      uVar6 = (uint)(*ppcVar2[0x1e] != '\0') * 2;
    }
  }
  wVar5 = uVar6 | wVar5;
  (el->el_terminal).t_flags = wVar5;
  if (((ppcVar2[0xe] == (char *)0x0) || (uVar6 = 1, *ppcVar2[0xe] == '\0')) &&
     ((ppcVar2[0xd] == (char *)0x0 || (uVar6 = 1, *ppcVar2[0xd] == '\0')))) {
    uVar6 = 0;
    if (ppcVar2[0x20] != (char *)0x0) {
      uVar6 = (uint)(*ppcVar2[0x20] != '\0');
    }
  }
  wVar5 = uVar6 | wVar5;
  (el->el_terminal).t_flags = wVar5;
  if ((ppcVar2[0x1a] == (char *)0x0) || (uVar6 = 0x20, *ppcVar2[0x1a] == '\0')) {
    uVar6 = 0;
    if (ppcVar2[0x23] != (char *)0x0) {
      uVar6 = (uint)(*ppcVar2[0x23] != '\0') << 5;
    }
  }
  wVar5 = uVar6 | wVar5;
  (el->el_terminal).t_flags = wVar5;
  wVar5 = (uint)(*pwVar1 != L'\0') << 7 | wVar5;
  (el->el_terminal).t_flags = wVar5;
  wVar5 = (uint)(pwVar1[6] != L'\0') << 8 | wVar5;
  (el->el_terminal).t_flags = wVar5;
  __s1 = ppcVar2[0x15];
  if (__s1 != (char *)0x0) {
    if (((*__s1 != '\0') && (pcVar3 = ppcVar2[0x1c], pcVar3 != (char *)0x0)) && (*pcVar3 != '\0')) {
      iVar4 = strcmp(__s1,pcVar3);
      wVar5 = wVar5 | (uint)(iVar4 == 0) << 4;
    }
    (el->el_terminal).t_flags = wVar5;
    if (*__s1 == '\0') {
      return;
    }
    pcVar3 = ppcVar2[0x17];
    if (pcVar3 == (char *)0x0) {
      return;
    }
    if (*pcVar3 == '\0') {
      return;
    }
    iVar4 = strcmp(__s1,pcVar3);
    wVar5 = wVar5 | (uint)(iVar4 == 0) << 4;
  }
  (el->el_terminal).t_flags = wVar5;
  return;
}

Assistant:

static void
terminal_setflags(EditLine *el)
{
	EL_FLAGS = 0;
	if (el->el_tty.t_tabs)
		EL_FLAGS |= (Val(T_pt) && !Val(T_xt)) ? TERM_CAN_TAB : 0;

	EL_FLAGS |= (Val(T_km) || Val(T_MT)) ? TERM_HAS_META : 0;
	EL_FLAGS |= GoodStr(T_ce) ? TERM_CAN_CEOL : 0;
	EL_FLAGS |= (GoodStr(T_dc) || GoodStr(T_DC)) ? TERM_CAN_DELETE : 0;
	EL_FLAGS |= (GoodStr(T_im) || GoodStr(T_ic) || GoodStr(T_IC)) ?
	    TERM_CAN_INSERT : 0;
	EL_FLAGS |= (GoodStr(T_up) || GoodStr(T_UP)) ? TERM_CAN_UP : 0;
	EL_FLAGS |= Val(T_am) ? TERM_HAS_AUTO_MARGINS : 0;
	EL_FLAGS |= Val(T_xn) ? TERM_HAS_MAGIC_MARGINS : 0;

	if (GoodStr(T_me) && GoodStr(T_ue))
		EL_FLAGS |= (strcmp(Str(T_me), Str(T_ue)) == 0) ?
		    TERM_CAN_ME : 0;
	else
		EL_FLAGS &= ~TERM_CAN_ME;
	if (GoodStr(T_me) && GoodStr(T_se))
		EL_FLAGS |= (strcmp(Str(T_me), Str(T_se)) == 0) ?
		    TERM_CAN_ME : 0;


#ifdef DEBUG_SCREEN
	if (!EL_CAN_UP) {
		(void) fprintf(el->el_errfile,
		    "WARNING: Your terminal cannot move up.\n");
		(void) fprintf(el->el_errfile,
		    "Editing may be odd for long lines.\n");
	}
	if (!EL_CAN_CEOL)
		(void) fprintf(el->el_errfile, "no clear EOL capability.\n");
	if (!EL_CAN_DELETE)
		(void) fprintf(el->el_errfile, "no delete char capability.\n");
	if (!EL_CAN_INSERT)
		(void) fprintf(el->el_errfile, "no insert char capability.\n");
#endif /* DEBUG_SCREEN */
}